

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

bool Js::JavascriptArray::CopyNativeFloatArrayElements
               (JavascriptNativeFloatArray *dstArray,uint32 dstIndex,
               JavascriptNativeFloatArray *srcArray,uint32 start,uint32 end)

{
  code *pcVar1;
  uint32 uVar2;
  bool bVar3;
  uint32 uVar4;
  uint *puVar5;
  undefined4 *puVar6;
  JavascriptArray *pJVar7;
  int iVar8;
  double newValue;
  JavascriptArray *varArray;
  undefined1 local_50 [4];
  uint n;
  ArrayElementEnumerator e;
  uint32 local_30;
  uint32 count;
  uint32 end_local;
  uint32 start_local;
  JavascriptNativeFloatArray *srcArray_local;
  JavascriptArray *pJStack_18;
  uint32 dstIndex_local;
  JavascriptNativeFloatArray *dstArray_local;
  
  local_30 = end;
  count = start;
  _end_local = (JavascriptArray *)srcArray;
  srcArray_local._4_4_ = dstIndex;
  pJStack_18 = (JavascriptArray *)dstArray;
  puVar5 = min<unsigned_int>(&local_30,
                             &(srcArray->super_JavascriptNativeArray).super_JavascriptArray.
                              super_ArrayObject.length);
  local_30 = *puVar5;
  if (count < local_30) {
    if (-srcArray_local._4_4_ - 1 < local_30 - count) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2d2b,"(end - start <= MaxArrayLength - dstIndex)",
                                  "end - start <= MaxArrayLength - dstIndex");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    if ((local_30 <= count) ||
       ((((JavascriptNativeArray *)&_end_local->super_ArrayObject)->super_JavascriptArray).
        super_ArrayObject.length < local_30)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x2d2c,"(start < end && end <= srcArray->length)",
                                  "start < end && end <= srcArray->length");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    e.end = 0;
    ArrayElementEnumerator::ArrayElementEnumerator
              ((ArrayElementEnumerator *)local_50,_end_local,count,local_30);
    while( true ) {
      bVar3 = ArrayElementEnumerator::MoveNext<double>((ArrayElementEnumerator *)local_50);
      uVar2 = srcArray_local._4_4_;
      if (!bVar3) break;
      uVar4 = ArrayElementEnumerator::GetIndex((ArrayElementEnumerator *)local_50);
      pJVar7 = pJStack_18;
      iVar8 = uVar4 - count;
      newValue = ArrayElementEnumerator::GetItem<double>((ArrayElementEnumerator *)local_50);
      DirectSetItemAt<double>(pJVar7,uVar2 + iVar8,newValue);
      e.end = e.end + 1;
    }
    if (count + e.end == local_30) {
      dstArray_local._7_1_ = false;
    }
    else {
      pJVar7 = JavascriptNativeFloatArray::ToVarArray((JavascriptNativeFloatArray *)pJStack_18);
      InternalFillFromPrototype(pJVar7,srcArray_local._4_4_,_end_local,count,local_30,e.end);
      dstArray_local._7_1_ = true;
    }
  }
  else {
    dstArray_local._7_1_ = false;
  }
  return dstArray_local._7_1_;
}

Assistant:

bool JavascriptArray::CopyNativeFloatArrayElements(JavascriptNativeFloatArray* dstArray, uint32 dstIndex, JavascriptNativeFloatArray* srcArray, uint32 start, uint32 end)
    {
        end = min(end, srcArray->length);
        if (start >= end)
        {
            return false;
        }

        Assert(end - start <= MaxArrayLength - dstIndex);
        Assert(start < end && end <= srcArray->length);

        uint32 count = 0;

        // iterate on the array itself
        ArrayElementEnumerator e(srcArray, start, end);
        while(e.MoveNext<double>())
        {
            uint n = dstIndex + (e.GetIndex() - start);
            dstArray->DirectSetItemAt(n, e.GetItem<double>());
            count++;
        }

        // iterate on the array's prototypes only if not all elements found
        if (start + count != end)
        {
            JavascriptArray *varArray = JavascriptNativeFloatArray::ToVarArray(dstArray);
            InternalFillFromPrototype(varArray, dstIndex, srcArray, start, end, count);
            return true;
        }

        return false;
    }